

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_LU_mult(m256v *LU,int *rp,int *cp,m256v *X,m256v *Y_out)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar5 = Y_out->n_row;
  if (0 < iVar5) {
    uVar4 = (ulong)(uint)Y_out->n_col;
    lVar3 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar6 = 0;
        do {
          Y_out->e[lVar6 + Y_out->rstride * lVar3] = '\0';
          lVar6 = lVar6 + 1;
          uVar4 = (ulong)Y_out->n_col;
        } while (lVar6 < (long)uVar4);
        iVar5 = Y_out->n_row;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar5);
  }
  uVar7 = LU->n_row;
  if (0 < (int)uVar7) {
    lVar3 = 0;
    do {
      if (lVar3 < LU->n_col) {
        iVar5 = rp[lVar3];
        lVar6 = (long)LU->n_col;
        do {
          lVar1 = lVar6 + -1;
          m256v_multadd_row_from
                    (X,cp[lVar6 + -1],0,LU->e[lVar6 + -1 + LU->rstride * lVar3],Y_out,iVar5);
          lVar6 = lVar1;
        } while (lVar3 < lVar1);
        uVar7 = LU->n_row;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)uVar7);
    if (0 < (int)uVar7) {
      uVar4 = (ulong)uVar7;
      uVar7 = uVar7 - 2;
      uVar8 = uVar4;
      do {
        uVar4 = uVar4 - 1;
        uVar11 = (ulong)uVar7;
        uVar9 = uVar8 - 1;
        iVar5 = LU->n_col;
        if ((long)iVar5 < (long)uVar8) {
          if (0 < iVar5) {
            uVar11 = (long)iVar5 + 1;
            do {
              m256v_multadd_row_from
                        (Y_out,rp[uVar11 - 2],0,LU->e[(uVar11 - 2) + LU->rstride * uVar4],Y_out,
                         rp[uVar9]);
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
          }
        }
        else {
          if (uVar8 < 2) {
            return;
          }
          uVar12 = uVar4 & 0xffffffff;
          do {
            m256v_multadd_row_from
                      (Y_out,rp[uVar11],0,LU->e[uVar11 + LU->rstride * uVar4],Y_out,rp[uVar9]);
            uVar11 = uVar11 - 1;
            uVar10 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar10;
          } while (0 < (int)uVar10);
        }
        uVar7 = uVar7 - 1;
        bVar2 = 1 < (long)uVar8;
        uVar8 = uVar9;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}